

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O3

bool Js::EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet *left,EquivalentTypeSet *right)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  
  if (left->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(left);
  }
  if (right->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(right);
  }
  if (right->count < left->count) {
LAB_0040d745:
    bVar3 = false;
  }
  else if (left->count == 0) {
    bVar3 = true;
  }
  else {
    uVar6 = (uint)right->count;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar5 = 0;
    uVar9 = 0;
    do {
      if ((int)uVar9 < (int)uVar6) {
        uVar9 = (ulong)(int)uVar9;
        lVar7 = uVar9 * 8;
        do {
          bVar3 = JITTypeHolderBase<Memory::Recycler>::operator<
                            ((left->types).ptr + uVar5,
                             (JITTypeHolderBase<Memory::Recycler> *)
                             ((long)&(((right->types).ptr)->t).ptr + lVar7));
          if (bVar3) goto LAB_0040d745;
          bVar3 = JITTypeHolderBase<Memory::Recycler>::operator==
                            ((left->types).ptr + uVar5,
                             (JITTypeHolderBase<Memory::Recycler> *)
                             ((long)&(((right->types).ptr)->t).ptr + lVar7));
          if (bVar3) {
            uVar9 = (ulong)((int)uVar9 + 1);
            uVar1 = right->count;
            bVar8 = 1;
            goto LAB_0040d7ee;
          }
          uVar9 = uVar9 + 1;
          uVar1 = right->count;
          lVar7 = lVar7 + 8;
        } while ((long)uVar9 < (long)(ulong)uVar1);
        bVar8 = 0;
LAB_0040d7ee:
        uVar6 = (uint)uVar1;
      }
      else {
        bVar8 = 0;
      }
      if ((int)uVar6 < (int)(uint)uVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                    ,0x77,"(j <= right->count)","j <= right->count");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        uVar6 = (uint)right->count;
      }
      bVar3 = (bool)(bVar8 | (uint)uVar9 != uVar6);
    } while ((bVar3 != false) && (uVar5 = uVar5 + 1, uVar5 < left->count));
  }
  return bVar3;
}

Assistant:

bool EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet * left, EquivalentTypeSet * right)
{
    if (!left->GetSortedAndDuplicatesRemoved())
    {
        left->SortAndRemoveDuplicates();
    }
    if (!right->GetSortedAndDuplicatesRemoved())
    {
        right->SortAndRemoveDuplicates();
    }

    if (left->count > right->count)
    {
        return false;
    }

    // Try to find each left type in the right set.
    int j = 0;
    for (int i = 0; i < left->count; i++)
    {
        bool found = false;
        for (; j < right->count; j++)
        {
            if (left->types[i] < right->types[j])
            {
                // Didn't find the left type. Fail.
                return false;
            }
            if (left->types[i] == right->types[j])
            {
                // Found the left type. Continue to the next left/right pair.
                found = true;
                j++;
                break;
            }
        }
        Assert(j <= right->count);
        if (j == right->count && !found)
        {
            // Exhausted the right set without finding the current left type.
            return false;
        }
    }
    return true;
}